

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool __thiscall
cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::valid_property
          (rules_holder<cppcms::xss::compare_c_string,_true> *this,c_string *tname,c_string *pname,
          c_string *value)

{
  undefined1 uVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  
  cVar3 = std::
          _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
          ::find(&(this->tags)._M_t,tname);
  if (((_Rb_tree_header *)cVar3._M_node != &(this->tags)._M_t._M_impl.super__Rb_tree_header) &&
     (cVar4 = std::
              _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
              ::find((_Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
                      *)&cVar3._M_node[2]._M_left,pname),
     cVar4._M_node != (_Base_ptr)&cVar3._M_node[2]._M_right)) {
    if (*(long *)(cVar4._M_node + 3) != 0) {
      uVar1 = (*(code *)cVar4._M_node[3]._M_parent)(&cVar4._M_node[2]._M_left);
      return (bool)uVar1;
    }
    bVar2 = details::c_string::compare(pname,value);
    if ((!bVar2) && (bVar2 = details::c_string::compare(value,pname), !bVar2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool valid_property(c_string const &tname,c_string const &pname,c_string const &value) const
		{
			typename tags_type::const_iterator pt = tags.find(tname);
			if(pt==tags.end())
				return false;
			typename properties_type::const_iterator pp = pt->second.properties.find(pname);
			if(pp == pt->second.properties.end())
				return false;
			if(pp->second == nullptr) {
				if(IsXHTML) {
					Comp cmp;
					if(!cmp(pname,value) && !cmp(value,pname))
						return true;
					return false;
				}
				else {
					return false; // Should be boolean in HTML
				}
			}
			if(pp->second(value.begin(),value.end()))
				return true;
			return false;
		}